

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

int32_t sysbvm_integer_subtractFromInto
                  (size_t leftWordCount,uint32_t *leftWords,size_t rightWordCount,
                  uint32_t *rightWords,size_t resultWordCount,uint32_t *resultWords)

{
  long lVar1;
  uint local_80;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  size_t i_1;
  uint32_t subtractionWord;
  int64_t subtraction;
  uint32_t rightWord;
  uint32_t leftWord;
  size_t i;
  size_t wordsToSum;
  int32_t borrow;
  uint32_t *resultWords_local;
  size_t resultWordCount_local;
  uint32_t *rightWords_local;
  size_t rightWordCount_local;
  uint32_t *leftWords_local;
  size_t leftWordCount_local;
  
  wordsToSum._4_4_ = 0;
  local_78 = rightWordCount;
  if (rightWordCount < leftWordCount) {
    local_78 = leftWordCount;
  }
  for (_rightWord = 0; _rightWord < local_78; _rightWord = _rightWord + 1) {
    if (_rightWord < leftWordCount) {
      local_7c = leftWords[_rightWord];
    }
    else {
      local_7c = 0;
    }
    if (_rightWord < rightWordCount) {
      local_80 = rightWords[_rightWord];
    }
    else {
      local_80 = 0;
    }
    lVar1 = ((ulong)local_7c - (ulong)local_80) + (long)wordsToSum._4_4_;
    if (_rightWord < resultWordCount) {
      resultWords[_rightWord] = (uint32_t)lVar1;
    }
    wordsToSum._4_4_ = (int)((ulong)lVar1 >> 0x20);
  }
  for (local_70 = local_78; local_70 < resultWordCount; local_70 = local_70 + 1) {
    if (local_70 < resultWordCount) {
      resultWords[local_70] = 0;
    }
  }
  return wordsToSum._4_4_;
}

Assistant:

static int32_t sysbvm_integer_subtractFromInto(size_t leftWordCount, uint32_t *leftWords, size_t rightWordCount, uint32_t *rightWords, size_t resultWordCount, uint32_t *resultWords)
{
    int32_t borrow = 0;
    
    size_t wordsToSum = leftWordCount > rightWordCount ? leftWordCount : rightWordCount;
    for(size_t i = 0; i < wordsToSum; ++i)
    {
        uint32_t leftWord = i < leftWordCount ? leftWords[i] : 0;
        uint32_t rightWord = i < rightWordCount ? rightWords[i] : 0;

        int64_t subtraction = (int64_t)leftWord - (int64_t)rightWord + (int64_t)borrow;
        uint32_t subtractionWord = (uint32_t)subtraction;
        if(i < resultWordCount)
            resultWords[i] = subtractionWord;

        borrow = (int32_t)(subtraction >> 32);
    }

    for(size_t i = wordsToSum; i < resultWordCount; ++i)
    {
        if(i < resultWordCount)
            resultWords[i] = 0;
    }

    return borrow;
}